

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_oarchive_impl.cpp
# Opt level: O3

void __thiscall boost::archive::json_oarchive_impl::save_end(json_oarchive_impl *this,char *name)

{
  json_archive *this_00;
  int iVar1;
  
  if (name != (char *)0x0) {
    this_00 = &(this->super_json_archive_interface).archive_;
    json_archive::pop_data(this_00);
    iVar1 = (this->super_json_archive_interface).array_level_;
    (this->super_json_archive_interface).array_level_ = iVar1 + -1;
    if ((this->array_stack_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)iVar1 + -1].second == true) {
      json_archive::pop_data(this_00);
      iVar1 = (this->super_json_archive_interface).array_level_ + 1;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::resize(&this->array_stack_,(long)iVar1);
    return;
  }
  return;
}

Assistant:

void json_oarchive_impl::save_end(const char* name)
{
    if(!name)
    {
        return;
    }
    //
    archive_.pop_data();
    if(array_stack_[--array_level_].second)
    {
        archive_.pop_data();
    }
    array_stack_.resize(array_level_ + 1);
}